

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

ExternFuncInfo * nullcFindModuleFunction(char *module,char *name,int index)

{
  uint uVar1;
  int iVar2;
  ByteCode *code;
  ExternFuncInfo *pEVar3;
  bool bVar4;
  TraceScope traceScope;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    pEVar3 = (ExternFuncInfo *)0x0;
  }
  else {
    if (nullcFindModuleFunction(char_const*,char_const*,int)::token == '\0') {
      iVar2 = __cxa_guard_acquire(&nullcFindModuleFunction(char_const*,char_const*,int)::token);
      if (iVar2 != 0) {
        nullcFindModuleFunction::token = NULLC::TraceGetToken("nullc","nullcFindModuleFunction");
        __cxa_guard_release(&nullcFindModuleFunction(char_const*,char_const*,int)::token);
      }
    }
    NULLC::TraceScope::TraceScope(&traceScope,nullcFindModuleFunction::token);
    NULLC::TraceLabel(module);
    code = (ByteCode *)BinaryCache::FindBytecode(module,true);
    if (code == (ByteCode *)0x0) {
      NULLC::nullcLastError = "ERROR: failed to find module";
    }
    else {
      uVar1 = NULLC::GetStringHash(name);
      pEVar3 = FindFirstFunc(code);
      iVar2 = code->functionCount - code->moduleFunctionCount;
      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        if (uVar1 == pEVar3->nameHash) {
          if (index == 0) goto LAB_001f24aa;
          index = index + -1;
        }
        pEVar3 = pEVar3 + 1;
      }
      NULLC::SafeSprintf(NULLC::errorBuf,0x10000,
                         "ERROR: function \'%s\' or one of it\'s overload is not found in module \'%s\'"
                         ,name,module);
      NULLC::nullcLastError = NULLC::errorBuf;
    }
    pEVar3 = (ExternFuncInfo *)0x0;
LAB_001f24aa:
    NULLC::TraceScope::~TraceScope(&traceScope);
  }
  return pEVar3;
}

Assistant:

ExternFuncInfo* nullcFindModuleFunction(const char* module, const char* name, int index)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(NULL);

	TRACE_SCOPE("nullc", "nullcFindModuleFunction");
	TRACE_LABEL(module);

	const char *bytecode = BinaryCache::FindBytecode(module, true);

	// Create module if not found
	if(!bytecode)
	{
		nullcLastError = "ERROR: failed to find module";
		return NULL;
	}

	unsigned hash = NULLC::GetStringHash(name);
	ByteCode *code = (ByteCode*)bytecode;

	// Find function and set pointer
	ExternFuncInfo *fInfo = FindFirstFunc(code);

	unsigned end = code->functionCount - code->moduleFunctionCount;

	for(unsigned i = 0; i < end; i++, fInfo++)
	{
		if(hash != fInfo->nameHash)
			continue;

		if(index == 0)
			return fInfo;

		index--;
	}

	NULLC::SafeSprintf(errorBuf, NULLC_ERROR_BUFFER_SIZE, "ERROR: function '%s' or one of it's overload is not found in module '%s'", name, module);

	nullcLastError = errorBuf;
	return NULL;
}